

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  char cVar6;
  byte bVar7;
  int iVar8;
  undefined8 uVar9;
  ImGuiTableSettings *p;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  if (pcVar4 != (char *)0x0) {
    p = (ImGuiTableSettings *)(pcVar4 + 4);
    do {
      if (p->ID != 0) {
        uVar2 = p->SaveFlags;
        uVar13 = -(uint)((uVar2 & 0xf) == 0);
        if ((uVar13 & 1) == 0) {
          iVar3 = (buf->Buf).Size;
          iVar8 = iVar3 + -1;
          if (iVar3 == 0) {
            iVar8 = 0;
          }
          ImGuiTextBuffer::reserve(buf,iVar8 + p->ColumnsCount * 0x32 + 0x1e);
          uVar11 = p->ID;
          ImGuiTextBuffer::appendf
                    (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)uVar11,
                     (ulong)(uint)(int)p->ColumnsCount);
          fVar1 = p->RefScale;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
          }
          cVar6 = p->ColumnsCount;
          if ('\0' < cVar6) {
            auVar5._4_4_ = -(uint)((uVar2 & 8) == 0);
            auVar5._0_4_ = uVar13;
            auVar5._8_4_ = -(uint)((uVar2 & 2) == 0);
            auVar5._12_4_ = -(uint)((uVar2 & 4) == 0);
            uVar13 = movmskps(uVar11,auVar5);
            pbVar10 = (byte *)((long)&p[1].RefScale + 3);
            uVar12 = 0;
            do {
              if ((*(int *)(pbVar10 + -7) == 0 && (uVar2 & 7) == 0) && (uVar13 & 2) == 0) {
                if (pbVar10[-1] != 0xff) goto LAB_0019a76e;
              }
              else if (*(int *)(pbVar10 + -7) != 0 || (uVar2 & 7) != 0) {
LAB_0019a76e:
                ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar12);
                if (*(int *)(pbVar10 + -7) != 0) {
                  ImGuiTextBuffer::appendf(buf," UserID=%08X");
                }
                if ((uVar2 & 1) != 0) {
                  bVar7 = *pbVar10;
                  if ((bVar7 & 8) != 0) {
                    ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar10 + -0xb));
                    bVar7 = *pbVar10;
                  }
                  if ((bVar7 & 8) == 0) {
                    ImGuiTextBuffer::appendf
                              (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar10 + -0xb));
                  }
                }
                if ((byte)((byte)uVar13 >> 3) == 0) {
                  ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar10 >> 2 & 1));
                }
                if ((uVar13 & 4) == 0) {
                  ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar10[-2]);
                }
                if (((uVar13 & 2) == 0) && ((int)(char)pbVar10[-1] != 0xffffffff)) {
                  uVar9 = 0x5e;
                  if ((*pbVar10 & 3) == 1) {
                    uVar9 = 0x76;
                  }
                  ImGuiTextBuffer::appendf
                            (buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar10[-1],uVar9);
                }
                ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
                cVar6 = p->ColumnsCount;
              }
              uVar11 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar11;
              pbVar10 = pbVar10 + 0xc;
            } while ((int)uVar11 < (int)cVar6);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
        }
      }
      p = ImChunkStream<ImGuiTableSettings>::next_chunk(&ctx->SettingsTables,p);
    } while (p != (ImGuiTableSettings *)0x0);
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}